

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float32_div_m68k(float32 a,float32 b,float_status *s)

{
  float32 fVar1;
  float fVar2;
  union_float32 ub;
  union_float32 ua;
  float local_20;
  float local_1c;
  
  local_20 = (float)b;
  local_1c = (float)a;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    float32_input_flush2((float32 *)&local_1c,(float32 *)&local_20,s);
    if (((ABS(local_1c) == 0.0) || ((((uint)local_1c >> 0x17) + 1 & 0xfe) != 0)) &&
       ((((uint)local_20 >> 0x17) + 1 & 0xfe) != 0)) {
      fVar2 = local_1c / local_20;
      if (ABS(fVar2) == INFINITY) {
        s->float_exception_flags = s->float_exception_flags | 8;
      }
      else if ((ABS(fVar2) <= 1.1754944e-38) && (ABS(local_1c) != 0.0)) goto LAB_0064a4d5;
      return (float32)fVar2;
    }
  }
LAB_0064a4d5:
  fVar1 = soft_f32_div((float32)local_1c,(float32)local_20,s);
  return fVar1;
}

Assistant:

float32 QEMU_FLATTEN
float32_div(float32 a, float32 b, float_status *s)
{
    return float32_gen2(a, b, s, hard_f32_div, soft_f32_div,
                        f32_div_pre, f32_div_post, NULL, NULL);
}